

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<deqp::gls::BuiltinPrecisionTests::Void> * deqp::gls::BuiltinPrecisionTests::voidP(void)

{
  int iVar1;
  
  if (voidP()::singleton == '\0') {
    iVar1 = __cxa_guard_acquire(&voidP()::singleton);
    if (iVar1 != 0) {
      constant<deqp::gls::BuiltinPrecisionTests::Void>((Void *)&voidP::singleton);
      __cxa_atexit(de::
                   SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                   ::~SharedPtr,&voidP::singleton,&__dso_handle);
      __cxa_guard_release(&voidP()::singleton);
    }
  }
  return &voidP::singleton;
}

Assistant:

const ExprP<Void>& voidP (void)
{
	static const ExprP<Void> singleton = constant(Void());

	return singleton;
}